

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O2

void __thiscall
BackwardPass::ProcessBailOutConstants
          (BackwardPass *this,BailOutInfo *bailOutInfo,
          BVSparse<Memory::JitArenaAllocator> *byteCodeUpwardExposedUsed,
          BVSparse<Memory::JitArenaAllocator> *bailoutReferencedArgSymsBv)

{
  GeneratorBailInInstr *pGVar1;
  code *pcVar2;
  bool bVar3;
  BOOLEAN BVar4;
  undefined4 *puVar5;
  Type *pTVar6;
  KeyValuePair<StackSym_*,_BailoutConstantValue> local_80;
  undefined1 local_68 [8];
  EditingIterator iter;
  
  if (this->tag == BackwardPhase) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x6e3,"(this->tag != Js::BackwardPhase)","this->tag != Js::BackwardPhase");
    if (!bVar3) {
LAB_003c6b3a:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  else {
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  local_68 = (undefined1  [8])bailOutInfo->usedCapturedValues;
  iter.super_Iterator.list =
       (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
        *)local_68;
  iter.last = (NodeBase *)local_68;
  while( true ) {
    if (iter.super_Iterator.list ==
        (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
         *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar3) goto LAB_003c6b3a;
      *puVar5 = 0;
    }
    iter.super_Iterator.list =
         (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
          *)((iter.super_Iterator.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
    if ((undefined1  [8])iter.super_Iterator.list == local_68) break;
    pTVar6 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
             ::Iterator::Data((Iterator *)local_68);
    BVSparse<Memory::JitArenaAllocator>::Clear
              (byteCodeUpwardExposedUsed,(pTVar6->key->super_Sym).m_id);
    BVSparse<Memory::JitArenaAllocator>::Clear
              (bailoutReferencedArgSymsBv,(pTVar6->key->super_Sym).m_id);
  }
  pGVar1 = bailOutInfo->bailInInstr;
  local_68 = (undefined1  [8])bailOutInfo->capturedValues;
  iter.super_Iterator.current = (NodeBase *)0x0;
  iter.super_Iterator.list =
       (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
        *)local_68;
  do {
    while( true ) {
      bVar3 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
              ::EditingIterator::Next((EditingIterator *)local_68);
      if (!bVar3) {
        return;
      }
      pTVar6 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
               ::Iterator::Data((Iterator *)local_68);
      if (pGVar1 != (GeneratorBailInInstr *)0x0) {
        local_80.key = pTVar6->key;
        local_80.value.type = (pTVar6->value).type;
        local_80.value._1_7_ = *(undefined7 *)&(pTVar6->value).field_0x1;
        local_80.value.u = (pTVar6->value).u;
        SListBase<JsUtil::KeyValuePair<StackSym*,BailoutConstantValue>,Memory::ArenaAllocator,RealCount>
        ::PrependNode<JsUtil::KeyValuePair<StackSym*,BailoutConstantValue>>
                  ((SListBase<JsUtil::KeyValuePair<StackSym*,BailoutConstantValue>,Memory::ArenaAllocator,RealCount>
                    *)&pGVar1->capturedValues,&this->func->m_alloc->super_ArenaAllocator,&local_80);
      }
      BVar4 = BVSparse<Memory::JitArenaAllocator>::TestAndClear
                        (byteCodeUpwardExposedUsed,(pTVar6->key->super_Sym).m_id);
      if (BVar4 == '\0') break;
LAB_003c6af7:
      SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
      ::EditingIterator::MoveCurrentTo
                ((EditingIterator *)local_68,
                 (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                  *)iter.last);
    }
    BVar4 = BVSparse<Memory::JitArenaAllocator>::TestAndClear
                      (bailoutReferencedArgSymsBv,(pTVar6->key->super_Sym).m_id);
    if (BVar4 != '\0') goto LAB_003c6af7;
    if (this->currentPrePassLoop == (Loop *)0x0) {
      SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
      ::EditingIterator::RemoveCurrent
                ((EditingIterator *)local_68,&this->func->m_alloc->super_ArenaAllocator);
    }
  } while( true );
}

Assistant:

void
BackwardPass::ProcessBailOutConstants(BailOutInfo * bailOutInfo, BVSparse<JitArenaAllocator> * byteCodeUpwardExposedUsed, BVSparse<JitArenaAllocator>* bailoutReferencedArgSymsBv)
{
    Assert(this->tag != Js::BackwardPhase);

    // Remove constants that we are already going to restore
    SListBase<ConstantStackSymValue> * usedConstantValues = &bailOutInfo->usedCapturedValues->constantValues;
    FOREACH_SLISTBASE_ENTRY(ConstantStackSymValue, value, usedConstantValues)
    {
        byteCodeUpwardExposedUsed->Clear(value.Key()->m_id);
        bailoutReferencedArgSymsBv->Clear(value.Key()->m_id);
    }
    NEXT_SLISTBASE_ENTRY;

    IR::GeneratorBailInInstr* bailInInstr = bailOutInfo->bailInInstr;

    // Find other constants that we need to restore
    FOREACH_SLISTBASE_ENTRY_EDITING(ConstantStackSymValue, value, &bailOutInfo->capturedValues->constantValues, iter)
    {
        if (bailInInstr)
        {
            // Store all captured constant values for the corresponding bailin instr
            bailInInstr->capturedValues.constantValues.PrependNode(this->func->m_alloc, value);
        }

        if (byteCodeUpwardExposedUsed->TestAndClear(value.Key()->m_id) || bailoutReferencedArgSymsBv->TestAndClear(value.Key()->m_id))
        {
            // Constant need to be restore, move it to the restore list
            iter.MoveCurrentTo(usedConstantValues);
        }
        else if (!this->IsPrePass())
        {
            // Constants don't need to be restored, delete
            iter.RemoveCurrent(this->func->m_alloc);
        }
    }
    NEXT_SLISTBASE_ENTRY_EDITING;
}